

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageOpen
              (Fts5Config *pConfig,Fts5Index *pIndex,int bCreate,Fts5Storage **pp,char **pzErr)

{
  int n;
  sqlite3_uint64 n_00;
  Fts5Storage *p_00;
  char *zBuf;
  size_t sVar1;
  int local_68;
  uint local_64;
  int iOff;
  int i;
  char *zDefn;
  int nDefn;
  sqlite3_int64 nByte;
  Fts5Storage *p;
  int rc;
  char **pzErr_local;
  Fts5Storage **pp_local;
  int bCreate_local;
  Fts5Index *pIndex_local;
  Fts5Config *pConfig_local;
  
  p._4_4_ = 0;
  n_00 = (long)pConfig->nCol * 8 + 0x80;
  p_00 = (Fts5Storage *)sqlite3_malloc64(n_00);
  *pp = p_00;
  if (p_00 == (Fts5Storage *)0x0) {
    pConfig_local._4_4_ = 7;
  }
  else {
    memset(p_00,0,n_00);
    p_00->aTotalSize = (i64 *)(p_00 + 1);
    p_00->pConfig = pConfig;
    p_00->pIndex = pIndex;
    if (bCreate != 0) {
      if (pConfig->eContent == 0) {
        n = pConfig->nCol * 10 + 0x20;
        zBuf = (char *)sqlite3_malloc64((long)pConfig->nCol * 10 + 0x20);
        if (zBuf == (char *)0x0) {
          p._4_4_ = 7;
        }
        else {
          sqlite3_snprintf(n,zBuf,"id INTEGER PRIMARY KEY");
          sVar1 = strlen(zBuf);
          local_68 = (int)sVar1;
          for (local_64 = 0; (int)local_64 < pConfig->nCol; local_64 = local_64 + 1) {
            sqlite3_snprintf(n - local_68,zBuf + local_68,", c%d",(ulong)local_64);
            sVar1 = strlen(zBuf + local_68);
            local_68 = (int)sVar1 + local_68;
          }
          p._4_4_ = sqlite3Fts5CreateTable(pConfig,"content",zBuf,0,pzErr);
        }
        sqlite3_free(zBuf);
      }
      if ((p._4_4_ == 0) && (pConfig->bColumnsize != 0)) {
        p._4_4_ = sqlite3Fts5CreateTable
                            (pConfig,"docsize","id INTEGER PRIMARY KEY, sz BLOB",0,pzErr);
      }
      if (p._4_4_ == 0) {
        p._4_4_ = sqlite3Fts5CreateTable(pConfig,"config","k PRIMARY KEY, v",1,pzErr);
      }
      if (p._4_4_ == 0) {
        p._4_4_ = sqlite3Fts5StorageConfigValue(p_00,"version",(sqlite3_value *)0x0,4);
      }
    }
    if (p._4_4_ != 0) {
      sqlite3Fts5StorageClose(p_00);
      *pp = (Fts5Storage *)0x0;
    }
    pConfig_local._4_4_ = p._4_4_;
  }
  return pConfig_local._4_4_;
}

Assistant:

static int sqlite3Fts5StorageOpen(
  Fts5Config *pConfig, 
  Fts5Index *pIndex, 
  int bCreate, 
  Fts5Storage **pp,
  char **pzErr                    /* OUT: Error message */
){
  int rc = SQLITE_OK;
  Fts5Storage *p;                 /* New object */
  sqlite3_int64 nByte;            /* Bytes of space to allocate */

  nByte = sizeof(Fts5Storage)               /* Fts5Storage object */
        + pConfig->nCol * sizeof(i64);      /* Fts5Storage.aTotalSize[] */
  *pp = p = (Fts5Storage*)sqlite3_malloc64(nByte);
  if( !p ) return SQLITE_NOMEM;

  memset(p, 0, (size_t)nByte);
  p->aTotalSize = (i64*)&p[1];
  p->pConfig = pConfig;
  p->pIndex = pIndex;

  if( bCreate ){
    if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
      int nDefn = 32 + pConfig->nCol*10;
      char *zDefn = sqlite3_malloc64(32 + (sqlite3_int64)pConfig->nCol * 10);
      if( zDefn==0 ){
        rc = SQLITE_NOMEM;
      }else{
        int i;
        int iOff;
        sqlite3_snprintf(nDefn, zDefn, "id INTEGER PRIMARY KEY");
        iOff = (int)strlen(zDefn);
        for(i=0; i<pConfig->nCol; i++){
          sqlite3_snprintf(nDefn-iOff, &zDefn[iOff], ", c%d", i);
          iOff += (int)strlen(&zDefn[iOff]);
        }
        rc = sqlite3Fts5CreateTable(pConfig, "content", zDefn, 0, pzErr);
      }
      sqlite3_free(zDefn);
    }

    if( rc==SQLITE_OK && pConfig->bColumnsize ){
      rc = sqlite3Fts5CreateTable(
          pConfig, "docsize", "id INTEGER PRIMARY KEY, sz BLOB", 0, pzErr
      );
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts5CreateTable(
          pConfig, "config", "k PRIMARY KEY, v", 1, pzErr
      );
    }
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts5StorageConfigValue(p, "version", 0, FTS5_CURRENT_VERSION);
    }
  }

  if( rc ){
    sqlite3Fts5StorageClose(p);
    *pp = 0;
  }
  return rc;
}